

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O2

iterator __thiscall CCoinsViewCache::FetchCoin(CCoinsViewCache *this,COutPoint *outpoint)

{
  Coin *this_00;
  long lVar1;
  CCoinsView *pCVar2;
  int iVar3;
  _Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false> __it;
  size_t sVar4;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>,_bool>
  pVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar5 = std::
          unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
          ::try_emplace<>(&this->cacheCoins,outpoint);
  __it._M_cur = (__node_type *)
                pVar5.first.
                super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
                _M_cur;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pCVar2 = (this->super_CCoinsViewBacked).base;
    this_00 = (Coin *)((long)__it._M_cur + 0x48);
    iVar3 = (**pCVar2->_vptr_CCoinsView)(pCVar2,outpoint,this_00);
    if ((char)iVar3 == '\0') {
      std::
      _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(&(this->cacheCoins)._M_h,(const_iterator)__it._M_cur);
      __it._M_cur = (__node_type *)0x0;
    }
    else {
      if ((this_00->out).nValue == -1) {
        CCoinsCacheEntry::AddFlags
                  ((CCoinsCacheEntry *)((long)__it._M_cur + 0x30),'\x02',
                   (CoinsCachePair *)((long)__it._M_cur + 8),&this->m_sentinel);
      }
      sVar4 = Coin::DynamicMemoryUsage(this_00);
      this->cachedCoinsUsage = this->cachedCoinsUsage + sVar4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)
           (_Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>)__it._M_cur;
  }
  __stack_chk_fail();
}

Assistant:

CCoinsMap::iterator CCoinsViewCache::FetchCoin(const COutPoint &outpoint) const {
    const auto [ret, inserted] = cacheCoins.try_emplace(outpoint);
    if (inserted) {
        if (!base->GetCoin(outpoint, ret->second.coin)) {
            cacheCoins.erase(ret);
            return cacheCoins.end();
        }
        if (ret->second.coin.IsSpent()) {
            // The parent only has an empty entry for this outpoint; we can consider our version as fresh.
            ret->second.AddFlags(CCoinsCacheEntry::FRESH, *ret, m_sentinel);
        }
        cachedCoinsUsage += ret->second.coin.DynamicMemoryUsage();
    }
    return ret;
}